

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMask.cpp
# Opt level: O1

int __thiscall
chrono::ChLinkMask::SetActiveRedundantByArray(ChLinkMask *this,int *mvector,int mcount)

{
  uint uVar1;
  pointer ppCVar2;
  ChConstraintTwoBodies *pCVar3;
  undefined4 extraout_var;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  ChLinkMask newmask;
  ChLinkMask local_40;
  
  ChLinkMask(&local_40,this);
  if (0 < mcount) {
    uVar1 = this->nconstr;
    ppCVar2 = (this->constraints).
              super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = 0;
    do {
      if (0 < (int)uVar1) {
        uVar5 = 0;
        iVar6 = 0;
        do {
          if ((ppCVar2[uVar5]->super_ChConstraintTwo).super_ChConstraint.active == true) {
            if (iVar6 == mvector[uVar4]) {
              pCVar3 = local_40.constraints.
                       super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar5];
              (pCVar3->super_ChConstraintTwo).super_ChConstraint.redundant = true;
              (pCVar3->super_ChConstraintTwo).super_ChConstraint.active = false;
            }
            iVar6 = iVar6 + 1;
          }
          uVar5 = uVar5 + 1;
        } while (uVar1 != uVar5);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)mcount);
  }
  if (0 < this->nconstr) {
    lVar7 = 0;
    do {
      pCVar3 = (this->constraints).
               super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar7];
      if (pCVar3 != (ChConstraintTwoBodies *)0x0) {
        (**(code **)((long)(pCVar3->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint + 8
                    ))();
      }
      iVar6 = (*(local_40.constraints.
                 super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar7]->super_ChConstraintTwo).
                super_ChConstraint._vptr_ChConstraint[2])();
      (this->constraints).
      super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar7] =
           (ChConstraintTwoBodies *)CONCAT44(extraout_var,iVar6);
      lVar7 = lVar7 + 1;
    } while (lVar7 < this->nconstr);
  }
  ~ChLinkMask(&local_40);
  return mcount;
}

Assistant:

int ChLinkMask::SetActiveRedundantByArray(int* mvector, int mcount) {
    int cnt;

    ChLinkMask newmask = *this;
    for (int elem = 0; elem < mcount; elem++) {
        cnt = 0;
        for (int i = 0; i < nconstr; i++) {
            if (constraints[i]->IsActive()) {
                if (cnt == mvector[elem])
                    newmask.constraints[i]->SetRedundant(true);
                cnt++;
            }
        }
    }

    // Replace the mask with updated one.
    for (int i = 0; i < nconstr; i++) {
        delete constraints[i];
        constraints[i] = newmask.constraints[i]->Clone();
    }

    return mcount;
}